

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

PartiallySignedTransaction *
ProcessPSBT(string *psbt_string,any *context,HidingSigningProvider *provider,int sighash_type,
           bool finalize)

{
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  size_type sVar4;
  SignatureData *pSVar5;
  ulong uVar6;
  ulong uVar7;
  PartiallySignedTransaction *in_RDI;
  byte in_R9B;
  long in_FS_OFFSET;
  uint i_3;
  uint i_2;
  PrecomputedTransactionData *txdata;
  Coin *coin;
  CTxIn *tx_in_1;
  PSBTInput *input;
  uint i_1;
  CTxIn *tx_in;
  PSBTInput *psbt_input;
  uint i;
  NodeContext *node;
  PartiallySignedTransaction *psbtx;
  CTransactionRef tx;
  uint256 block_hash;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  string error;
  uint in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  CTxOut *in_stack_fffffffffffffcd0;
  CTxOut *in_stack_fffffffffffffcd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  undefined6 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd06;
  undefined1 in_stack_fffffffffffffd07;
  string *in_stack_fffffffffffffd08;
  CTxMemPool *in_stack_fffffffffffffd10;
  reference in_stack_fffffffffffffd18;
  int code;
  SignatureData *in_stack_fffffffffffffd20;
  pointer in_stack_fffffffffffffd28;
  PrecomputedTransactionData *in_stack_fffffffffffffd30;
  pointer in_stack_fffffffffffffd38;
  PartiallySignedTransaction *in_stack_fffffffffffffd40;
  reference in_stack_fffffffffffffd48;
  CTransactionRef *tx_00;
  undefined7 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  uint uVar8;
  TxIndex *in_stack_fffffffffffffd98;
  uint local_244;
  uint local_22c;
  CTransactionRef local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  PartiallySignedTransaction::PartiallySignedTransaction
            ((PartiallySignedTransaction *)
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  tx_00 = local_28;
  std::__cxx11::string::string(in_stack_fffffffffffffce0);
  uVar1 = DecodeBase64PSBT((PartiallySignedTransaction *)in_stack_fffffffffffffd20,
                           (string *)in_stack_fffffffffffffd18,(string *)in_stack_fffffffffffffd10);
  if ((bool)uVar1) {
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)
                       CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    if (bVar2) {
      std::unique_ptr<TxIndex,_std::default_delete<TxIndex>_>::operator->
                ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      BaseIndex::BlockUntilSyncedToCurrentChain((BaseIndex *)in_stack_fffffffffffffd40);
    }
    EnsureAnyNodeContext
              ((any *)CONCAT17(in_stack_fffffffffffffd07,
                               CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)));
    std::
    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
    map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
         *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    local_22c = 0;
    while( true ) {
      std::optional<CMutableTransaction>::operator->
                ((optional<CMutableTransaction> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      sVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      if (sVar4 <= local_22c) break;
      std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at
                ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffcd8,
                 (size_type)in_stack_fffffffffffffcd0);
      std::optional<CMutableTransaction>::operator->
                ((optional<CMutableTransaction> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      in_stack_fffffffffffffd48 =
           std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffcd8,
                      (size_type)in_stack_fffffffffffffcd0);
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      if (!bVar2) {
        std::shared_ptr<const_CTransaction>::shared_ptr
                  ((shared_ptr<const_CTransaction> *)
                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)
                           CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        if (bVar2) {
          uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8))
          ;
          in_stack_fffffffffffffd38 =
               std::unique_ptr<TxIndex,_std::default_delete<TxIndex>_>::operator->
                         ((unique_ptr<TxIndex,_std::default_delete<TxIndex>_> *)
                          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          in_stack_fffffffffffffd40 =
               (PartiallySignedTransaction *)
               transaction_identifier::operator_cast_to_uint256_
                         ((transaction_identifier<false> *)
                          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          TxIndex::FindTx(in_stack_fffffffffffffd98,
                          (uint256 *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                          (uint256 *)CONCAT17(uVar1,in_stack_fffffffffffffd88),tx_00);
        }
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        if (!bVar2) {
          in_stack_fffffffffffffd28 =
               std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator->
                         ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)
                          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          in_stack_fffffffffffffd30 =
               (PrecomputedTransactionData *)
               transaction_identifier::operator_cast_to_uint256_
                         ((transaction_identifier<false> *)
                          CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          CTxMemPool::get(in_stack_fffffffffffffd10,(uint256 *)in_stack_fffffffffffffd08);
          std::shared_ptr<const_CTransaction>::operator=
                    ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcd8,
                     (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcd0);
          std::shared_ptr<const_CTransaction>::~shared_ptr
                    ((shared_ptr<const_CTransaction> *)
                     CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        }
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        if (bVar2) {
          std::shared_ptr<const_CTransaction>::operator=
                    ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcd8,
                     (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffcd0);
        }
        else {
          std::
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                        *)in_stack_fffffffffffffcf0,
                       (key_type *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
        }
        std::shared_ptr<const_CTransaction>::~shared_ptr
                  ((shared_ptr<const_CTransaction> *)
                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      }
      local_22c = local_22c + 1;
    }
    bVar2 = std::
            map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
            ::empty((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                     *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    if (!bVar2) {
      ::node::FindCoins((NodeContext *)in_stack_fffffffffffffd30,
                        (map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                         *)in_stack_fffffffffffffd28);
      local_244 = 0;
      while( true ) {
        in_stack_fffffffffffffd20 = (SignatureData *)(ulong)local_244;
        std::optional<CMutableTransaction>::operator->
                  ((optional<CMutableTransaction> *)
                   CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        pSVar5 = (SignatureData *)
                 std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                           ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                            CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        if (pSVar5 <= in_stack_fffffffffffffd20) break;
        in_stack_fffffffffffffd18 =
             std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at
                       ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffcd8,
                        (size_type)in_stack_fffffffffffffcd0);
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
        if (!bVar2) {
          std::optional<CMutableTransaction>::operator->
                    ((optional<CMutableTransaction> *)
                     CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          std::vector<CTxIn,_std::allocator<CTxIn>_>::at
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffcd8,
                     (size_type)in_stack_fffffffffffffcd0);
          in_stack_fffffffffffffd08 =
               (string *)
               std::
               map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
               ::at((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                     *)in_stack_fffffffffffffcf0,
                    (key_type *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8));
          in_stack_fffffffffffffd07 =
               CTxOut::IsNull((CTxOut *)
                              CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
          if ((!(bool)in_stack_fffffffffffffd07) &&
             (in_stack_fffffffffffffd06 =
                   IsSegWitOutput((SigningProvider *)in_stack_fffffffffffffd20,
                                  (CScript *)in_stack_fffffffffffffd18),
             (bool)in_stack_fffffffffffffd06)) {
            CTxOut::operator=(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
          }
        }
        local_244 = local_244 + 1;
      }
    }
    PrecomputePSBTData(in_stack_fffffffffffffd40);
    uVar8 = 0;
    while( true ) {
      uVar6 = (ulong)uVar8;
      std::optional<CMutableTransaction>::operator->
                ((optional<CMutableTransaction> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      sVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      if (sVar4 <= uVar6) break;
      std::vector<PSBTInput,_std::allocator<PSBTInput>_>::at
                ((vector<PSBTInput,_std::allocator<PSBTInput>_> *)in_stack_fffffffffffffcd8,
                 (size_type)in_stack_fffffffffffffcd0);
      bVar2 = PSBTInputSigned((PSBTInput *)
                              CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      if (!bVar2) {
        in_stack_fffffffffffffcc8 = (uint)(in_R9B & 1);
        SignPSBTInput((SigningProvider *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                      (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),in_stack_fffffffffffffd30,
                      (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),in_stack_fffffffffffffd20,
                      SUB81((ulong)in_stack_fffffffffffffd18 >> 0x38,0));
      }
      uVar8 = uVar8 + 1;
    }
    uVar8 = 0;
    while( true ) {
      uVar7 = (ulong)uVar8;
      std::optional<CMutableTransaction>::operator->
                ((optional<CMutableTransaction> *)
                 CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      sVar4 = std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                        ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                         CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
      if (sVar4 <= uVar7) break;
      UpdatePSBTOutput((SigningProvider *)in_stack_fffffffffffffd08,
                       (PartiallySignedTransaction *)
                       CONCAT17(in_stack_fffffffffffffd07,
                                CONCAT16(in_stack_fffffffffffffd06,in_stack_fffffffffffffd00)),
                       (int)(uVar6 >> 0x20));
      uVar8 = uVar8 + 1;
    }
    RemoveUnnecessaryTransactions
              ((PartiallySignedTransaction *)in_stack_fffffffffffffd20,
               (int *)in_stack_fffffffffffffd18);
    PrecomputedTransactionData::~PrecomputedTransactionData
              ((PrecomputedTransactionData *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::
    map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>::
    ~map((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return in_RDI;
    }
  }
  else {
    uVar3 = __cxa_allocate_exception(0x58);
    code = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    tinyformat::format<std::__cxx11::string>(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    JSONRPCError(code,in_stack_fffffffffffffd08);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

PartiallySignedTransaction ProcessPSBT(const std::string& psbt_string, const std::any& context, const HidingSigningProvider& provider, int sighash_type, bool finalize)
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, psbt_string, error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    if (g_txindex) g_txindex->BlockUntilSyncedToCurrentChain();
    const NodeContext& node = EnsureAnyNodeContext(context);

    // If we can't find the corresponding full transaction for all of our inputs,
    // this will be used to find just the utxos for the segwit inputs for which
    // the full transaction isn't found
    std::map<COutPoint, Coin> coins;

    // Fetch previous transactions:
    // First, look in the txindex and the mempool
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInput& psbt_input = psbtx.inputs.at(i);
        const CTxIn& tx_in = psbtx.tx->vin.at(i);

        // The `non_witness_utxo` is the whole previous transaction
        if (psbt_input.non_witness_utxo) continue;

        CTransactionRef tx;

        // Look in the txindex
        if (g_txindex) {
            uint256 block_hash;
            g_txindex->FindTx(tx_in.prevout.hash, block_hash, tx);
        }
        // If we still don't have it look in the mempool
        if (!tx) {
            tx = node.mempool->get(tx_in.prevout.hash);
        }
        if (tx) {
            psbt_input.non_witness_utxo = tx;
        } else {
            coins[tx_in.prevout]; // Create empty map entry keyed by prevout
        }
    }

    // If we still haven't found all of the inputs, look for the missing ones in the utxo set
    if (!coins.empty()) {
        FindCoins(node, coins);
        for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
            PSBTInput& input = psbtx.inputs.at(i);

            // If there are still missing utxos, add them if they were found in the utxo set
            if (!input.non_witness_utxo) {
                const CTxIn& tx_in = psbtx.tx->vin.at(i);
                const Coin& coin = coins.at(tx_in.prevout);
                if (!coin.out.IsNull() && IsSegWitOutput(provider, coin.out.scriptPubKey)) {
                    input.witness_utxo = coin.out;
                }
            }
        }
    }

    const PrecomputedTransactionData& txdata = PrecomputePSBTData(psbtx);

    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        if (PSBTInputSigned(psbtx.inputs.at(i))) {
            continue;
        }

        // Update script/keypath information using descriptor data.
        // Note that SignPSBTInput does a lot more than just constructing ECDSA signatures.
        // We only actually care about those if our signing provider doesn't hide private
        // information, as is the case with `descriptorprocesspsbt`
        SignPSBTInput(provider, psbtx, /*index=*/i, &txdata, sighash_type, /*out_sigdata=*/nullptr, finalize);
    }

    // Update script/keypath information using descriptor data.
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        UpdatePSBTOutput(provider, psbtx, i);
    }

    RemoveUnnecessaryTransactions(psbtx, /*sighash_type=*/1);

    return psbtx;
}